

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscContext.h
# Opt level: O0

char * __thiscall CNscContext::GetDefineValue(CNscContext *this,char *pszDefine)

{
  bool bVar1;
  FastHashMapStr *this_00;
  long in_RDI;
  bool in_stack_0000001f;
  DefineEntry *in_stack_00000020;
  CNscContext *in_stack_00000028;
  const_iterator it;
  unordered_map<CNscContext::FastHashMapStr,_CNscContext::DefineEntry_*,_CNscContext::FastHashMapStrHasher,_std::equal_to<CNscContext::FastHashMapStr>,_std::allocator<std::pair<const_CNscContext::FastHashMapStr,_CNscContext::DefineEntry_*>_>_>
  *in_stack_ffffffffffffffa8;
  _Node_iterator_base<std::pair<const_CNscContext::FastHashMapStr,_CNscContext::DefineEntry_*>,_true>
  local_40 [3];
  _Node_iterator_base<std::pair<const_CNscContext::FastHashMapStr,_CNscContext::DefineEntry_*>,_true>
  local_28;
  _Node_iterator_base<std::pair<const_CNscContext::FastHashMapStr,_CNscContext::DefineEntry_*>,_true>
  local_20 [3];
  char *local_8;
  
  this_00 = (FastHashMapStr *)(in_RDI + 0x858);
  FastHashMapStr::FastHashMapStr(this_00,(char *)in_stack_ffffffffffffffa8);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<CNscContext::FastHashMapStr,_CNscContext::DefineEntry_*,_CNscContext::FastHashMapStrHasher,_std::equal_to<CNscContext::FastHashMapStr>,_std::allocator<std::pair<const_CNscContext::FastHashMapStr,_CNscContext::DefineEntry_*>_>_>
       ::find(in_stack_ffffffffffffffa8,(key_type *)0x1edfc1);
  std::__detail::
  _Node_const_iterator<std::pair<const_CNscContext::FastHashMapStr,_CNscContext::DefineEntry_*>,_false,_true>
  ::_Node_const_iterator
            ((_Node_const_iterator<std::pair<const_CNscContext::FastHashMapStr,_CNscContext::DefineEntry_*>,_false,_true>
              *)this_00,
             (_Node_iterator<std::pair<const_CNscContext::FastHashMapStr,_CNscContext::DefineEntry_*>,_false,_true>
              *)in_stack_ffffffffffffffa8);
  local_40[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<CNscContext::FastHashMapStr,_CNscContext::DefineEntry_*,_CNscContext::FastHashMapStrHasher,_std::equal_to<CNscContext::FastHashMapStr>,_std::allocator<std::pair<const_CNscContext::FastHashMapStr,_CNscContext::DefineEntry_*>_>_>
       ::end(in_stack_ffffffffffffffa8);
  bVar1 = std::__detail::operator==(local_20,local_40);
  if (bVar1) {
    local_8 = (char *)0x0;
  }
  else {
    std::__detail::
    _Node_const_iterator<std::pair<const_CNscContext::FastHashMapStr,_CNscContext::DefineEntry_*>,_false,_true>
    ::operator->((_Node_const_iterator<std::pair<const_CNscContext::FastHashMapStr,_CNscContext::DefineEntry_*>,_false,_true>
                  *)0x1ee015);
    GetDefineValue_abi_cxx11_(in_stack_00000028,in_stack_00000020,in_stack_0000001f);
    local_8 = (char *)std::__cxx11::string::c_str();
  }
  return local_8;
}

Assistant:

const char *GetDefineValue (const char *pszDefine)
	{
		DefineLookupMap::const_iterator it = m_cDefineLookup .find (pszDefine);

		if (it == m_cDefineLookup .end ())
			return NULL;

		return GetDefineValue (it ->second) ->c_str ();
	}